

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::Deferred<kj::Function<void_()>_>::~Deferred(Deferred<kj::Function<void_()>_> *this)

{
  run(this);
  NullableValue<kj::Function<void_()>_>::~NullableValue
            ((NullableValue<kj::Function<void_()>_> *)this);
  return;
}

Assistant:

~Deferred() noexcept(false) {
    run();
  }